

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O2

void __thiscall Assimp::glTFImporter::ImportMeshes(glTFImporter *this,Asset *r)

{
  uint *puVar1;
  int a;
  pointer ppMVar2;
  Mesh *pMVar3;
  size_t sVar4;
  long *plVar5;
  Accessor *acc;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint b;
  uint c;
  aiMesh *paVar9;
  float *pfVar10;
  ulong *puVar11;
  Logger *pLVar12;
  aiFace *paVar13;
  DeadlyImportError *pDVar14;
  uint i_2;
  pointer pPVar15;
  ulong uVar16;
  size_t tc;
  ulong uVar17;
  uint number;
  long lVar18;
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar19;
  uint i;
  long lVar20;
  uint *puVar21;
  Ref<glTF::Buffer> RVar22;
  ulong local_108;
  aiFace *local_100;
  uint k;
  ulong local_e0;
  aiMesh *aim;
  Indexer data;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  string local_50;
  
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  k = 0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar17 = 0;
  do {
    ppMVar2 = (r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(r->meshes).mObjs.
                       super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppMVar2) >> 3 & 0xffffffff) <=
        uVar17) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->meshOffsets,&k);
      BaseImporter::CopyVector<aiMesh*>(&meshes,&this->mScene->mMeshes,&this->mScene->mNumMeshes);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
      return;
    }
    pMVar3 = ppMVar2[uVar17];
    local_e0 = uVar17;
    if (*(size_t *)
         ((long)&(pMVar3->Extension).
                 super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                 ._M_impl + 0x10) != 0) {
      plVar19 = &pMVar3->Extension;
      while (plVar19 = *(list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                         **)&(plVar19->
                             super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                             )._M_impl._M_node, plVar19 != &pMVar3->Extension) {
        sVar4 = *(size_t *)
                 ((long)&(plVar19->
                         super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                         )._M_impl._M_node + 0x10);
        if (*(int *)(sVar4 + 8) != 0) {
          pDVar14 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          to_string<glTF::Mesh::SExtension::EType>(&local_50,*(EType *)(sVar4 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aim,
                         "GLTF: Can not import mesh: unknown mesh extension (code: \"",&local_50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aim,
                         "\"), only Open3DGC is supported.");
          DeadlyImportError::DeadlyImportError(pDVar14,(string *)&data);
          __cxa_throw(pDVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (2 < (ulong)(((long)*(pointer *)
                                ((long)&(pMVar3->primitives).
                                        super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                        ._M_impl + 8) -
                        *(long *)&(pMVar3->primitives).
                                  super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                  ._M_impl.super__Vector_impl_data) / 0xd0)) {
          pDVar14 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&data,
                     "GLTF: When using Open3DGC compression then only one primitive per mesh are allowed."
                     ,(allocator<char> *)&aim);
          DeadlyImportError::DeadlyImportError(pDVar14,(string *)&data);
          __cxa_throw(pDVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        RVar22 = glTF::LazyDict<glTF::Buffer>::Get(&r->buffers,(string *)(sVar4 + 0x10));
        glTF::Buffer::EncodedRegion_SetCurrent
                  (((RVar22.vector)->
                   super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[RVar22._8_8_ & 0xffffffff],
                   &(pMVar3->super_Object).id);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->meshOffsets,&k);
    lVar18 = *(long *)&(pMVar3->primitives).
                       super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                       ._M_impl.super__Vector_impl_data;
    pPVar15 = *(pointer *)
               ((long)&(pMVar3->primitives).
                       super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                       ._M_impl + 8);
    k = k + (int)(((long)pPVar15 - lVar18) / 0xd0);
    for (number = 0; (ulong)number < (ulong)(((long)pPVar15 - lVar18) / 0xd0); number = number + 1)
    {
      paVar9 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar9);
      aim = paVar9;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&meshes,&aim);
      paVar9 = aim;
      uVar17 = (pMVar3->super_Object).id._M_string_length;
      if (uVar17 < 0x400) {
        (aim->mName).length = (ai_uint32)uVar17;
        memcpy((aim->mName).data,(pMVar3->super_Object).id._M_dataplus._M_p,uVar17);
        (paVar9->mName).data[uVar17] = '\0';
      }
      paVar9 = aim;
      if (1 < (ulong)(((long)*(pointer *)
                              ((long)&(pMVar3->primitives).
                                      super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                      ._M_impl + 8) -
                      *(long *)&(pMVar3->primitives).
                                super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                ._M_impl.super__Vector_impl_data) / 0xd0)) {
        uVar6 = (aim->mName).length;
        (aim->mName).data[uVar6] = '-';
        uVar6 = ASSIMP_itoa10((aim->mName).data + (ulong)uVar6 + 1,0x3ff - uVar6,number);
        (paVar9->mName).length = uVar6 + (paVar9->mName).length + 1;
      }
      puVar21 = (uint *)(lVar18 + (ulong)number * 0xd0);
      if ((ulong)*puVar21 < 7) {
        aim->mPrimitiveTypes = aim->mPrimitiveTypes | *(uint *)(&DAT_0060bec0 + (ulong)*puVar21 * 4)
        ;
      }
      plVar5 = *(long **)(puVar21 + 2);
      if ((*(long **)(puVar21 + 4) != plVar5) && ((long *)*plVar5 != (long *)0x0)) {
        aim->mNumVertices =
             *(uint *)(*(long *)(*(long *)*plVar5 + (ulong)*(uint *)(plVar5 + 1) * 8) + 100);
        glTF::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)
                    (*(long *)**(undefined8 **)(puVar21 + 2) +
                    (ulong)*(uint *)(*(undefined8 **)(puVar21 + 2) + 1) * 8),&aim->mVertices);
      }
      plVar5 = *(long **)(puVar21 + 8);
      if ((*(long **)(puVar21 + 10) != plVar5) && ((long *)*plVar5 != (long *)0x0)) {
        glTF::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)(*(long *)*plVar5 + (ulong)*(uint *)(plVar5 + 1) * 8),
                   &aim->mNormals);
      }
      for (uVar17 = 0;
          (uVar17 < 8 &&
          (lVar18 = *(long *)(puVar21 + 0xe),
          uVar17 < (ulong)(*(long *)(puVar21 + 0x10) - lVar18 >> 4))); uVar17 = uVar17 + 1) {
        lVar20 = uVar17 * 0x10;
        glTF::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)
                    (**(long **)(lVar18 + lVar20) + (ulong)*(uint *)(lVar18 + 8 + lVar20) * 8),
                   aim->mTextureCoords + uVar17);
        aim->mNumUVComponents[uVar17] =
             *(uint *)(&DAT_00758b18 +
                      (ulong)*(uint *)(*(long *)(**(long **)(*(long *)(puVar21 + 0xe) + lVar20) +
                                                (ulong)*(uint *)(*(long *)(puVar21 + 0xe) + 8 +
                                                                lVar20) * 8) + 0x68) * 0x10);
        pfVar10 = &aim->mTextureCoords[uVar17]->y;
        for (uVar16 = 0; uVar16 < aim->mNumVertices; uVar16 = uVar16 + 1) {
          *pfVar10 = 1.0 - *pfVar10;
          pfVar10 = pfVar10 + 3;
        }
      }
      if (*(long **)(puVar21 + 0x2c) == (long *)0x0) {
        uVar6 = *puVar21;
        if (uVar6 < 7) {
          uVar7 = aim->mNumVertices;
          uVar17 = (ulong)uVar7;
          switch(uVar6) {
          case 0:
            puVar11 = (ulong *)operator_new__(uVar17 * 0x10 + 8);
            *puVar11 = uVar17;
            local_100 = (aiFace *)(puVar11 + 1);
            if (uVar7 != 0) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + uVar17);
            }
            paVar13 = local_100;
            for (uVar16 = 0; local_108 = uVar17, uVar17 != uVar16; uVar16 = uVar16 + 1) {
              SetFace(paVar13,(int)uVar16);
              paVar13 = paVar13 + 1;
            }
            break;
          case 1:
            uVar6 = uVar7;
            if ((uVar7 & 0xfffffffe) != uVar7) {
              pLVar12 = DefaultLogger::get();
              Logger::warn(pLVar12,
                           "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                          );
              uVar6 = uVar7 & 0xfffffffe;
            }
            local_108 = (ulong)(uVar7 >> 1);
            puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
            *puVar11 = local_108;
            local_100 = (aiFace *)(puVar11 + 1);
            if (1 < uVar7) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_108);
            }
            paVar13 = local_100;
            for (uVar17 = 0; uVar17 < uVar6; uVar17 = uVar17 + 2) {
              SetFace(paVar13,(int)uVar17,(int)uVar17 + 1);
              paVar13 = paVar13 + 1;
            }
            break;
          default:
            uVar6 = uVar7 - (uVar6 == 3);
            local_108 = (ulong)uVar6;
            puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
            *puVar11 = local_108;
            local_100 = (aiFace *)(puVar11 + 1);
            if (uVar6 != 0) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_108);
            }
            SetFace(local_100,0,1);
            paVar13 = (aiFace *)(puVar11 + 3);
            for (uVar16 = 2; uVar16 < uVar17; uVar16 = uVar16 + 1) {
              SetFace(paVar13,paVar13[-1].mIndices[1],(int)uVar16);
              paVar13 = paVar13 + 1;
            }
            if (*puVar21 == 2) {
              SetFace(local_100 + (uVar7 - 1),*(int *)(puVar11[(ulong)(uVar7 - 2) * 2 + 2] + 4),
                      *(int *)puVar11[2]);
            }
            break;
          case 4:
            local_108 = uVar17 / 3;
            uVar6 = (int)local_108 * 3;
            uVar8 = uVar7;
            if (uVar6 != uVar7) {
              pLVar12 = DefaultLogger::get();
              Logger::warn(pLVar12,
                           "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                          );
              uVar8 = uVar6;
            }
            puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
            *puVar11 = local_108;
            local_100 = (aiFace *)(puVar11 + 1);
            if (2 < uVar7) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_108);
            }
            for (uVar6 = 0; uVar6 < uVar8; uVar6 = uVar6 + 3) {
              SetFace(local_100 + (ulong)uVar6 / 3,uVar6,uVar6 + 1,uVar6 + 2);
            }
            break;
          case 5:
            local_108 = (ulong)(uVar7 - 2);
            puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
            *puVar11 = local_108;
            local_100 = (aiFace *)(puVar11 + 1);
            if (uVar7 - 2 != 0) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_108);
            }
            SetFace(local_100,0,1,2);
            paVar13 = (aiFace *)(puVar11 + 3);
            for (uVar16 = 3; uVar16 < uVar17; uVar16 = uVar16 + 1) {
              SetFace(paVar13,paVar13[1].mIndices[1],paVar13[1].mIndices[2],(int)uVar16);
              paVar13 = paVar13 + 1;
            }
            break;
          case 6:
            local_108 = (ulong)(uVar7 - 2);
            puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
            *puVar11 = local_108;
            local_100 = (aiFace *)(puVar11 + 1);
            if (uVar7 - 2 != 0) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_108);
            }
            SetFace(local_100,0,1,2);
            paVar13 = (aiFace *)(puVar11 + 3);
            for (uVar16 = 3; uVar16 < uVar17; uVar16 = uVar16 + 1) {
              SetFace(paVar13,*(int *)puVar11[2],paVar13[1].mIndices[2],(int)uVar16);
              paVar13 = paVar13 + 1;
            }
          }
          goto LAB_0056776c;
        }
      }
      else {
        acc = *(Accessor **)(**(long **)(puVar21 + 0x2c) + (ulong)puVar21[0x2e] * 8);
        uVar6 = acc->count;
        uVar17 = (ulong)uVar6;
        glTF::Accessor::Indexer::Indexer(&data,acc);
        if (data.data == (uint8_t *)0x0) {
          __assert_fail("data.IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFImporter.cpp"
                        ,0x142,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
        }
        switch(*puVar21) {
        case 0:
          puVar11 = (ulong *)operator_new__(uVar17 * 0x10 + 8);
          *puVar11 = uVar17;
          local_100 = (aiFace *)(puVar11 + 1);
          if (uVar6 != 0) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + uVar17);
          }
          paVar13 = local_100;
          for (uVar16 = 0; local_108 = uVar17, uVar17 != uVar16; uVar16 = uVar16 + 1) {
            uVar6 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar16);
            SetFace(paVar13,uVar6);
            paVar13 = paVar13 + 1;
          }
          break;
        case 1:
          uVar7 = uVar6;
          if ((uVar6 & 0xfffffffe) != uVar6) {
            pLVar12 = DefaultLogger::get();
            Logger::warn(pLVar12,
                         "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                        );
            uVar7 = uVar6 & 0xfffffffe;
          }
          local_108 = (ulong)(uVar6 >> 1);
          puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
          *puVar11 = local_108;
          local_100 = (aiFace *)(puVar11 + 1);
          if (1 < uVar6) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_108);
          }
          paVar13 = local_100;
          for (uVar17 = 0; uVar17 < uVar7; uVar17 = uVar17 + 2) {
            uVar6 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar17);
            uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar17 + 1);
            SetFace(paVar13,uVar6,uVar8);
            paVar13 = paVar13 + 1;
          }
          break;
        case 2:
        case 3:
          uVar7 = uVar6 - (*puVar21 == 3);
          local_108 = (ulong)uVar7;
          puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
          *puVar11 = local_108;
          local_100 = (aiFace *)(puVar11 + 1);
          if (uVar7 != 0) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_108);
          }
          uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,0);
          uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,1);
          SetFace(local_100,uVar7,uVar8);
          paVar13 = (aiFace *)(puVar11 + 3);
          for (uVar16 = 2; uVar16 < uVar17; uVar16 = uVar16 + 1) {
            uVar7 = paVar13[-1].mIndices[1];
            uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar16);
            SetFace(paVar13,uVar7,uVar8);
            paVar13 = paVar13 + 1;
          }
          if (*puVar21 == 2) {
            SetFace(local_100 + (uVar6 - 1),*(int *)(puVar11[(ulong)(uVar6 - 2) * 2 + 2] + 4),
                    *(int *)puVar11[2]);
          }
          break;
        case 4:
          local_108 = uVar17 / 3;
          uVar7 = (int)local_108 * 3;
          uVar8 = uVar6;
          if (uVar7 != uVar6) {
            pLVar12 = DefaultLogger::get();
            Logger::warn(pLVar12,
                         "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                        );
            uVar8 = uVar7;
          }
          puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
          *puVar11 = local_108;
          local_100 = (aiFace *)(puVar11 + 1);
          if (2 < uVar6) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_108);
          }
          for (uVar6 = 0; uVar6 < uVar8; uVar6 = uVar6 + 3) {
            uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,uVar6);
            b = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,uVar6 + 1);
            c = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,uVar6 + 2);
            SetFace(local_100 + (ulong)uVar6 / 3,uVar7,b,c);
          }
          break;
        case 5:
          local_108 = (ulong)(uVar6 - 2);
          puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
          *puVar11 = local_108;
          local_100 = (aiFace *)(puVar11 + 1);
          if (uVar6 - 2 != 0) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_108);
          }
          uVar6 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,0);
          uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,1);
          uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,2);
          SetFace(local_100,uVar6,uVar7,uVar8);
          paVar13 = (aiFace *)(puVar11 + 3);
          for (uVar16 = 3; uVar16 < uVar17; uVar16 = uVar16 + 1) {
            uVar6 = paVar13[1].mIndices[1];
            uVar7 = paVar13[1].mIndices[2];
            uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar16);
            SetFace(paVar13,uVar6,uVar7,uVar8);
            paVar13 = paVar13 + 1;
          }
          break;
        case 6:
          local_108 = (ulong)(uVar6 - 2);
          puVar11 = (ulong *)operator_new__(local_108 * 0x10 + 8);
          *puVar11 = local_108;
          local_100 = (aiFace *)(puVar11 + 1);
          if (uVar6 - 2 != 0) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_108);
          }
          uVar6 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,0);
          uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,1);
          uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,2);
          SetFace(local_100,uVar6,uVar7,uVar8);
          paVar13 = (aiFace *)(puVar11 + 3);
          for (uVar16 = 3; uVar16 < uVar17; uVar16 = uVar16 + 1) {
            a = *(int *)puVar11[2];
            uVar6 = paVar13[1].mIndices[2];
            uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar16);
            SetFace(paVar13,a,uVar6,uVar7);
            paVar13 = paVar13 + 1;
          }
          break;
        default:
          goto switchD_00566f35_default;
        }
LAB_0056776c:
        aim->mFaces = local_100;
        aim->mNumFaces = (uint)local_108;
        for (uVar17 = 0; uVar17 != local_108; uVar17 = uVar17 + 1) {
          uVar16 = 0;
          while (local_100[uVar17].mNumIndices != uVar16) {
            puVar1 = local_100[uVar17].mIndices + uVar16;
            uVar16 = uVar16 + 1;
            if (aim->mNumVertices <= *puVar1) {
              if (uVar17 < local_108) {
                __assert_fail("CheckValidFacesIndices(faces, nFaces, aim->mNumVertices)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFImporter.cpp"
                              ,0x1d5,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
              }
              goto switchD_00566f35_default;
            }
          }
        }
      }
switchD_00566f35_default:
      if (*(long *)(puVar21 + 0x30) != 0) {
        aim->mMaterialIndex = puVar21[0x32];
      }
      lVar18 = *(long *)&(pMVar3->primitives).
                         super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                         ._M_impl.super__Vector_impl_data;
      pPVar15 = *(pointer *)
                 ((long)&(pMVar3->primitives).
                         super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                         ._M_impl + 8);
    }
    uVar17 = local_e0 + 1;
  } while( true );
}

Assistant:

void glTFImporter::ImportMeshes(glTF::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

		// Check if mesh extensions is used
		if(mesh.Extension.size() > 0)
		{
			for(Mesh::SExtension* cur_ext : mesh.Extension)
			{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
				if(cur_ext->Type == Mesh::SExtension::EType::Compression_Open3DGC)
				{
					// Limitations for meshes when using Open3DGC-compression.
					// It's a current limitation of sp... Specification have not this part still - about mesh compression. Why only one primitive?
					// Because glTF is very flexibly. But in fact it ugly flexible. Every primitive can has own set of accessors and accessors can
					// point to a-a-a-a-any part of buffer (through bufferview of course) and even to another buffer. We know that "Open3DGC-compression"
					// is applicable only to part of buffer. As we can't guaranty continuity of the data for decoder, we will limit quantity of primitives.
					// Yes indices, coordinates etc. still can br stored in different buffers, but with current specification it's a exporter problem.
					// Also primitive can has only one of "POSITION", "NORMAL" and less then "AI_MAX_NUMBER_OF_TEXTURECOORDS" of "TEXCOORD". All accessor
					// of primitive must point to one continuous region of the buffer.
					if(mesh.primitives.size() > 2) throw DeadlyImportError("GLTF: When using Open3DGC compression then only one primitive per mesh are allowed.");

					Mesh::SCompression_Open3DGC* o3dgc_ext = (Mesh::SCompression_Open3DGC*)cur_ext;
					Ref<Buffer> buf = r.buffers.Get(o3dgc_ext->Buffer);

					buf->EncodedRegion_SetCurrent(mesh.id);
				}
				else
#endif
				{
					throw DeadlyImportError("GLTF: Can not import mesh: unknown mesh extension (code: \"" + to_string(cur_ext->Type) +
											"\"), only Open3DGC is supported.");
				}
			}
		}// if(mesh.Extension.size() > 0)

		meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.id;
            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = attr.position[0]->count;
                attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) attr.normal[0]->ExtractData(aim->mNormals);

            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }


            aiFace* faces = 0;
            unsigned int nFaces = 0;

            if (prim.indices) {
                unsigned int count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        if (nFaces * 2 != count) {
                            ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
                            count = nFaces * 2;
                        }
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        if (nFaces * 3 != count) {
                            ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
                            count = nFaces * 3;
                        }
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks 
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    if (nFaces * 2 != count) {
                        ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
                        count = nFaces * 2;
                    }
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    if (nFaces * 3 != count) {
                        ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
                        count = nFaces * 3;
                    }
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = nFaces;
                ai_assert(CheckValidFacesIndices(faces, nFaces, aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}